

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O1

void __thiscall
absl::lts_20250127::str_format_internal::FormatSinkImpl::Append(FormatSinkImpl *this,string_view v)

{
  char *pcVar1;
  char *__dest;
  ulong __n;
  string_view sVar2;
  
  __n = v._M_len;
  if (__n != 0) {
    this->size_ = this->size_ + __n;
    __dest = this->pos_;
    if ((ulong)((long)this + (0x420 - (long)__dest)) <= __n) {
      pcVar1 = this->buf_;
      sVar2._M_len = (long)__dest - (long)pcVar1;
      sVar2._M_str = pcVar1;
      (*(this->raw_).write_)((this->raw_).sink_,sVar2);
      this->pos_ = pcVar1;
      (*(this->raw_).write_)((this->raw_).sink_,v);
      return;
    }
    memcpy(__dest,v._M_str,__n);
    this->pos_ = this->pos_ + __n;
  }
  return;
}

Assistant:

void Append(string_view v) {
    size_t n = v.size();
    if (n == 0) return;
    size_ += n;
    if (n >= Avail()) {
      Flush();
      raw_.Write(v);
      return;
    }
    memcpy(pos_, v.data(), n);
    pos_ += n;
  }